

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O2

bool __thiscall QHstsHeaderParser::parseDirective(QHstsHeaderParser *this)

{
  QByteArray *lhs;
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  char *local_60;
  QArrayDataPointer<char> local_58;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = nextToken(this);
  if (!bVar1) {
LAB_0016cead:
    bVar1 = false;
    goto LAB_0016ceaf;
  }
  bVar1 = true;
  if ((this->token).d.size == 0) goto LAB_0016ceaf;
  lhs = &this->token;
  local_40.d = (Data *)0x23c78d;
  bVar2 = ::operator==(lhs,(char **)&local_40);
  if (bVar2) goto LAB_0016ceaf;
  bVar1 = isTOKEN(*(this->token).d.ptr);
  if (!bVar1) goto LAB_0016cead;
  local_40.d = (this->token).d.d;
  local_40.ptr = (this->token).d.ptr;
  local_40.size = (this->token).d.size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar1 = nextToken(this);
  if (bVar1) {
    local_58.size = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char *)0x0;
    local_60 = ";";
    bVar1 = ::operator==(lhs,&local_60);
    if (bVar1) {
      bVar1 = processDirective(this,(QByteArray *)&local_40,(QByteArray *)&local_58);
    }
    else {
      local_60 = "=";
      bVar1 = ::operator==(lhs,&local_60);
      if (bVar1) {
        bVar1 = nextToken(this);
        if ((bVar1) && ((this->token).d.size != 0)) {
          QByteArray::operator=((QByteArray *)&local_58,lhs);
LAB_0016cf18:
          bVar1 = processDirective(this,(QByteArray *)&local_40,(QByteArray *)&local_58);
          if (bVar1) {
            bVar1 = nextToken(this);
            goto LAB_0016cf3d;
          }
        }
      }
      else if ((this->token).d.size == 0) goto LAB_0016cf18;
      bVar1 = false;
    }
LAB_0016cf3d:
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  }
  else {
    bVar1 = false;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
LAB_0016ceaf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QHstsHeaderParser::parseDirective()
{
    // RFC 6797, 6.1:
    //
    // directive = directive-name [ "=" directive-value ]
    // directive-name = token
    // directive-value = token | quoted-string


    // RFC 2616, 2.2:
    //
    // token          = 1*<any CHAR except CTLs or separators>

    if (!nextToken())
        return false;

    if (!token.size()) // No more data, but no error.
        return true;

    if (token == ";") // That's a weird grammar, but that's what it is.
        return true;

    if (!isTOKEN(token.at(0))) // Not a valid directive-name.
        return false;

    const QByteArray directiveName = token;
    // 2. Try to read "=" or ";".
    if (!nextToken())
        return false;

    QByteArray directiveValue;
    if (token == ";") // No directive-value
        return processDirective(directiveName, directiveValue);

    if (token == "=") {
        // We expect a directive-value now:
        if (!nextToken() || !token.size())
            return false;
        directiveValue = token;
    } else if (token.size()) {
        // Invalid syntax:
        return false;
    }

    if (!processDirective(directiveName, directiveValue))
        return false;

    // Read either ";", or 'end of header', or some invalid token.
    return nextToken();
}